

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O0

void __thiscall
QNullTextureRenderTarget::QNullTextureRenderTarget
          (QNullTextureRenderTarget *this,QRhiImplementation *rhi,
          QRhiTextureRenderTargetDescription *desc,Flags flags)

{
  long lVar1;
  QRhiImplementation *in_RDX;
  QRhiTextureRenderTarget *in_RSI;
  QRhiTextureRenderTargetDescription *in_RDI;
  long in_FS_OFFSET;
  QRhiImplementation *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRhiTextureRenderTarget::QRhiTextureRenderTarget
            (in_RSI,in_RDX,in_RDI,
             (QFlagsStorageHelper<QRhiTextureRenderTarget::Flag,_4>)SUB84((ulong)in_RDI >> 0x20,0));
  (in_RDI->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.a =
       (qsizetype)&PTR__QNullTextureRenderTarget_00e1e058;
  QNullRenderTargetData::QNullRenderTargetData
            ((QNullRenderTargetData *)in_RDI,in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNullTextureRenderTarget::QNullTextureRenderTarget(QRhiImplementation *rhi,
                                                   const QRhiTextureRenderTargetDescription &desc,
                                                   Flags flags)
    : QRhiTextureRenderTarget(rhi, desc, flags),
      d(rhi)
{
}